

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O1

uint64_t __thiscall cfd::core::CfdCoreManager::GetSupportedFunction(CfdCoreManager *this)

{
  return 3;
}

Assistant:

uint64_t CfdCoreManager::GetSupportedFunction() {
  uint64_t support_function = 0;

#ifndef CFD_DISABLE_BITCOIN
  support_function |= LibraryFunction::kEnableBitcoin;
#endif  // CFD_DISABLE_BITCOIN

#ifndef CFD_DISABLE_ELEMENTS
  support_function |= LibraryFunction::kEnableElements;
#endif  // CFD_DISABLE_ELEMENTS

  return support_function;
}